

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::FrameBufferBindingTestCase::test
          (FrameBufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  GLuint framebufferId;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  string local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  GLuint local_44;
  code *local_40;
  GLenum local_38;
  
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  local_44 = 0;
  glu::CallLogWrapper::glGenFramebuffers(gl,1,&local_44);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_c8._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar7 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_c8._M_string_length + local_a0) goto LAB_00f95c78;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
    }
    else {
LAB_00f95c78:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_e8 = &local_d8;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_d8 = *plVar3;
      uStack_d0 = puVar2[3];
    }
    else {
      local_d8 = *plVar3;
      local_e8 = (long *)*puVar2;
    }
    local_e0 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindFramebuffer(gl,0x8d40,local_44);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_c8._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar7 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_c8._M_string_length + local_a0) goto LAB_00f95ec9;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
    }
    else {
LAB_00f95ec9:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_e8 = &local_d8;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_d8 = *plVar3;
      uStack_d0 = puVar2[3];
    }
    else {
      local_d8 = *plVar3;
      local_e8 = (long *)*puVar2;
    }
    local_e0 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8ca6,local_44,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindFramebuffer(gl,0x8d40,0);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_c8._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar7 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_c8._M_string_length + local_a0) goto LAB_00f96130;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
    }
    else {
LAB_00f96130:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_e8 = &local_d8;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_d8 = *plVar3;
      uStack_d0 = puVar2[3];
    }
    else {
      local_d8 = *plVar3;
      local_e8 = (long *)*puVar2;
    }
    local_e0 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar5;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindFramebuffer(gl,0x8d40,local_44);
  glu::CallLogWrapper::glDeleteFramebuffers(gl,1,&local_44);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 == 0) goto LAB_00f96551;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
  local_40 = glu::getErrorName;
  local_38 = GVar1;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_40);
  uVar6 = 0xf;
  if (local_a8 != local_98) {
    uVar6 = local_98[0];
  }
  if (uVar6 < local_c8._M_string_length + local_a0) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar7 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_c8._M_string_length + local_a0) goto LAB_00f963ac;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_00f963ac:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
  }
  local_e8 = &local_d8;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_d8 = *plVar3;
    uStack_d0 = puVar2[3];
  }
  else {
    local_d8 = *plVar3;
    local_e8 = (long *)*puVar2;
  }
  local_e0 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_68.field_2._M_allocated_capacity = *psVar5;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar5;
    local_68._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
LAB_00f96551:
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8ca6,0,(this->super_BindingTest).m_type)
  ;
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);

		GLuint framebufferId = 0;
		gl.glGenFramebuffers(1, &framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenFramebuffers");

		gl.glBindFramebuffer(GL_FRAMEBUFFER, framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindFramebuffer");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, framebufferId, m_type);

		gl.glBindFramebuffer(GL_FRAMEBUFFER, 0);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindFramebuffer");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);

		gl.glBindFramebuffer(GL_FRAMEBUFFER, framebufferId);
		gl.glDeleteFramebuffers(1, &framebufferId);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteFramebuffers");

		verifyStateInteger(result, gl, GL_FRAMEBUFFER_BINDING, 0, m_type);
	}